

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormaps.cpp
# Opt level: O1

void R_SetDefaultColormap(char *name)

{
  BYTE *pBVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  FDynamicColormap foo;
  BYTE remap [256];
  BYTE unremap [256];
  BYTE map [256];
  FWadLump local_370;
  byte local_338 [256];
  byte local_238 [256];
  byte local_138 [264];
  
  iVar2 = strncasecmp((fakecmaps.Array)->name,name,8);
  if (iVar2 != 0) {
    iVar2 = FWadCollection::CheckNumForFullName(&Wads,name,true,3);
    if (iVar2 == -1) {
      iVar2 = FWadCollection::CheckNumForName(&Wads,name,0);
    }
    if (((iVar2 == -1) ||
        (iVar3 = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0), -1 < iVar3)) ||
       (iVar3 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0), -1 < iVar3)) {
      Printf("Make colormap\n");
      local_370.super_FileReader.File =
           (FILE *)(DrawerCommandQueue::Instance::queue.memorypool + 0x89a6ff);
      local_370.super_FileReader.super_FileReaderBase._vptr_FileReaderBase =
           (_func_int **)realcolormaps;
      local_370.super_FileReader.Length._0_4_ = 0;
      local_370.super_FileReader.StartPos = 0;
      FDynamicColormap::BuildLights((FDynamicColormap *)&local_370);
    }
    else {
      FWadCollection::OpenLumpNum(&local_370,&Wads,iVar2);
      memcpy(local_338,GPalette.Remap,0x100);
      lVar6 = 0;
      memset(local_238,0,0x100);
      do {
        local_238[local_338[lVar6]] = (byte)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      local_338[0] = 0;
      lVar6 = 0;
      lVar5 = 0;
      do {
        pBVar1 = realcolormaps;
        FWadLump::Read(&local_370,local_138,0x100);
        lVar4 = 0;
        do {
          pBVar1[lVar4 + lVar6] = local_338[local_138[local_238[lVar4]]];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x100);
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x100;
      } while (lVar5 != 0x20);
      FWadLump::~FWadLump(&local_370);
    }
    uppercopy((fakecmaps.Array)->name,name);
    ((fakecmaps.Array)->blend).field_0.d = 0;
    return;
  }
  return;
}

Assistant:

void R_SetDefaultColormap (const char *name)
{
	if (strnicmp (fakecmaps[0].name, name, 8) != 0)
	{
		int lump, i, j;
		BYTE map[256];
		BYTE unremap[256];
		BYTE remap[256];

		lump = Wads.CheckNumForFullName (name, true, ns_colormaps);
		if (lump == -1)
			lump = Wads.CheckNumForName (name, ns_global);

		// [RH] If using BUILD's palette, generate the colormap
		if (lump == -1 || Wads.CheckNumForFullName("palette.dat") >= 0 || Wads.CheckNumForFullName("blood.pal") >= 0)
		{
			Printf ("Make colormap\n");
			FDynamicColormap foo;

			foo.Color = 0xFFFFFF;
			foo.Fade = 0;
			foo.Maps = realcolormaps;
			foo.Desaturate = 0;
			foo.Next = NULL;
			foo.BuildLights ();
		}
		else
		{
			FWadLump lumpr = Wads.OpenLumpNum (lump);

			// [RH] The colormap may not have been designed for the specific
			// palette we are using, so remap it to match the current palette.
			memcpy (remap, GPalette.Remap, 256);
			memset (unremap, 0, 256);
			for (i = 0; i < 256; ++i)
			{
				unremap[remap[i]] = i;
			}
			// Mapping to color 0 is okay, because the colormap won't be used to
			// produce a masked texture.
			remap[0] = 0;
			for (i = 0; i < NUMCOLORMAPS; ++i)
			{
				BYTE *map2 = &realcolormaps[i*256];
				lumpr.Read (map, 256);
				for (j = 0; j < 256; ++j)
				{
					map2[j] = remap[map[unremap[j]]];
				}
			}
		}

		uppercopy (fakecmaps[0].name, name);
		fakecmaps[0].blend = 0;
	}
}